

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

Wlc_Ntk_t * Wlc_NtkDupDfs(Wlc_Ntk_t *p,int fMarked,int fSeq)

{
  Wlc_Obj_t *pWVar1;
  ushort uVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Wlc_Ntk_t *pNew;
  ulong uVar9;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar10;
  char *pcVar11;
  Vec_Int_t *pVVar12;
  size_t sVar13;
  Wlc_Obj_t *pWVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(400);
  pVVar7->pArray = piVar8;
  uVar17 = p->nObjsAlloc;
  if ((p->vCopies).nCap < (int)uVar17) {
    piVar8 = (p->vCopies).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar17 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar17 << 2);
    }
    (p->vCopies).pArray = piVar8;
    if (piVar8 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = uVar17;
  }
  if (0 < (int)uVar17) {
    memset((p->vCopies).pArray,0,(ulong)uVar17 * 4);
  }
  (p->vCopies).nSize = uVar17;
  pNew = Wlc_NtkAlloc(p->pName,p->nObjsAlloc);
  iVar6 = p->fAsyncRst;
  iVar3 = p->fMemPorts;
  iVar5 = p->fEasyFfs;
  pNew->fSmtLib = p->fSmtLib;
  pNew->fAsyncRst = iVar6;
  pNew->fMemPorts = iVar3;
  pNew->fEasyFfs = iVar5;
  iVar6 = (p->vCis).nSize;
  if (0 < iVar6) {
    lVar18 = 0;
    do {
      iVar3 = (p->vCis).pArray[lVar18];
      lVar15 = (long)iVar3;
      if ((lVar15 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_0036d7f7;
      pWVar14 = p->pObjs;
      uVar2 = *(ushort *)(pWVar14 + lVar15);
      if ((fMarked == 0) || ((uVar2 & 0x80) != 0)) {
        pWVar1 = pWVar14 + lVar15;
        if (fSeq == 0) {
          *(ushort *)pWVar1 = (uVar2 & 0xffc0) + 1;
          pWVar14 = p->pObjs;
        }
        Wlc_ObjDup(pNew,p,(int)((ulong)((long)pWVar1 - (long)pWVar14) >> 3) * -0x55555555,pVVar7);
        *(ushort *)pWVar1 = uVar2 & 0x3f | (ushort)*(undefined4 *)pWVar1 & 0xffc0;
        iVar6 = (p->vCis).nSize;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar6);
  }
  uVar17 = (p->vFfs2).nSize;
  uVar9 = (ulong)uVar17;
  if (0 < (int)uVar17) {
    lVar18 = 0;
    do {
      if ((int)uVar9 <= lVar18) goto LAB_0036d816;
      iVar6 = (p->vFfs2).pArray[lVar18];
      if (((long)iVar6 < 1) || (p->nObjsAlloc <= iVar6)) goto LAB_0036d7f7;
      pWVar14 = p->pObjs + iVar6;
      iVar6 = Wlc_ObjAlloc(pNew,*(ushort *)pWVar14 & 0x3f,*(ushort *)pWVar14 >> 6 & 1,pWVar14->End,
                           pWVar14->Beg);
      uVar17 = (int)((long)pWVar14 - (long)p->pObjs >> 3) * -0x55555555;
      if (((int)uVar17 < 0) || ((p->vCopies).nSize <= (int)uVar17)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vCopies).pArray[uVar17 & 0x7fffffff] = iVar6;
      Vec_IntPush(&pNew->vFfs2,iVar6);
      lVar18 = lVar18 + 1;
      uVar9 = (ulong)(p->vFfs2).nSize;
    } while (lVar18 < (long)uVar9);
  }
  iVar6 = (p->vCos).nSize;
  if (0 < iVar6) {
    lVar18 = 0;
    do {
      iVar3 = (p->vCos).pArray[lVar18];
      if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_0036d7f7;
      if ((fMarked == 0) ||
         ((undefined1  [24])((undefined1  [24])p->pObjs[iVar3] & (undefined1  [24])0x80) !=
          (undefined1  [24])0x0)) {
        Wlc_NtkDupDfs_rec(pNew,p,iVar3,pVVar7);
        iVar6 = (p->vCos).nSize;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar6);
    if (0 < iVar6) {
      lVar18 = 0;
      do {
        iVar3 = (p->vCos).pArray[lVar18];
        lVar15 = (long)iVar3;
        if ((lVar15 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_0036d7f7;
        if ((fMarked == 0) ||
           ((undefined1  [24])((undefined1  [24])p->pObjs[lVar15] & (undefined1  [24])0x80) !=
            (undefined1  [24])0x0)) {
          if ((p->vCopies).nSize <= iVar3) goto LAB_0036d816;
          iVar6 = (p->vCopies).pArray[lVar15];
          if (((long)iVar6 < 1) || (pNew->nObjsAlloc <= iVar6)) goto LAB_0036d7f7;
          if (fSeq == 0) {
            uVar17 = 0;
          }
          else {
            uVar17 = *(uint *)(p->pObjs + lVar15) >> 10 & 1;
          }
          Wlc_ObjSetCo(pNew,pNew->pObjs + iVar6,uVar17);
          iVar6 = (p->vCos).nSize;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < iVar6);
    }
  }
  uVar17 = (p->vFfs2).nSize;
  uVar9 = (ulong)uVar17;
  if (0 < (int)uVar17) {
    lVar18 = 0;
    do {
      if ((int)uVar9 <= lVar18) {
LAB_0036d816:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = (p->vFfs2).pArray[lVar18];
      lVar15 = (long)iVar6;
      if ((lVar15 < 1) || (p->nObjsAlloc <= iVar6)) {
LAB_0036d7f7:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar14 = p->pObjs + lVar15;
      uVar9 = (ulong)pWVar14->nFanins;
      if (0 < (int)pWVar14->nFanins) {
        lVar16 = 0;
        do {
          if ((2 < (uint)uVar9) ||
             (paVar10 = &pWVar14->field_10, (*(uint *)pWVar14 & 0x3f | 0x10) == 0x16)) {
            paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar14->field_10).pFanins[0];
          }
          Wlc_NtkDupDfs_rec(pNew,p,paVar10->Fanins[lVar16],pVVar7);
          lVar16 = lVar16 + 1;
          uVar9 = (ulong)(int)pWVar14->nFanins;
        } while (lVar16 < (long)uVar9);
      }
      Wlc_ObjCollectCopyFanins(p,iVar6,pVVar7);
      if ((p->vCopies).nSize <= iVar6) goto LAB_0036d816;
      iVar6 = (p->vCopies).pArray[lVar15];
      if (((long)iVar6 < 1) || (pNew->nObjsAlloc <= iVar6)) goto LAB_0036d7f7;
      pWVar1 = pNew->pObjs + iVar6;
      Wlc_ObjAddFanins(pNew,pWVar1,pVVar7);
      *(ushort *)pWVar1 = (ushort)*(undefined4 *)pWVar1 & 0xf7ff | *(ushort *)pWVar14 & 0x800;
      lVar18 = lVar18 + 1;
      uVar9 = (ulong)(p->vFfs2).nSize;
    } while (lVar18 < (long)uVar9);
  }
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
  }
  free(pVVar7);
  if ((fSeq != 0) && (pVVar7 = p->vInits, pVVar7 != (Vec_Int_t *)0x0)) {
    if (fMarked == 0) {
      pVVar12 = (Vec_Int_t *)malloc(0x10);
      iVar6 = pVVar7->nSize;
      pVVar12->nSize = iVar6;
      pVVar12->nCap = iVar6;
      if ((long)iVar6 == 0) {
        sVar13 = 0;
        piVar8 = (int *)0x0;
      }
      else {
        sVar13 = (long)iVar6 << 2;
        piVar8 = (int *)malloc(sVar13);
      }
      pVVar12->pArray = piVar8;
      memcpy(piVar8,pVVar7->pArray,sVar13);
      pNew->vInits = pVVar12;
      pcVar4 = p->pInits;
      if (pcVar4 == (char *)0x0) goto LAB_0036d767;
      sVar13 = strlen(pcVar4);
      pcVar11 = (char *)malloc(sVar13 + 1);
      strcpy(pcVar11,pcVar4);
    }
    else {
      pVVar7 = Wlc_ReduceMarkedInitVec(p,pVVar7);
      pNew->vInits = pVVar7;
      if (p->pInits == (char *)0x0) goto LAB_0036d767;
      pcVar11 = Wlc_ReduceMarkedInitStr(p,p->pInits);
    }
    pNew->pInits = pcVar11;
  }
LAB_0036d767:
  pcVar4 = p->pSpec;
  if (pcVar4 != (char *)0x0) {
    sVar13 = strlen(pcVar4);
    pcVar11 = (char *)malloc(sVar13 + 1);
    strcpy(pcVar11,pcVar4);
    pNew->pSpec = pcVar11;
  }
  if (0 < (p->vNameIds).nSize) {
    Wlc_NtkTransferNames(pNew,p);
  }
  iVar6 = (p->vPoPairs).nSize;
  if ((iVar6 != 0) && (0 < iVar6)) {
    lVar18 = 0;
    do {
      Vec_IntPush(&pNew->vPoPairs,(p->vPoPairs).pArray[lVar18]);
      lVar18 = lVar18 + 1;
    } while (lVar18 < (p->vPoPairs).nSize);
  }
  return pNew;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkDupDfs( Wlc_Ntk_t * p, int fMarked, int fSeq )
{
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj, * pObjNew;
    Vec_Int_t * vFanins;
    int i, k, iObj, iFanin;
    vFanins = Vec_IntAlloc( 100 );
    Wlc_NtkCleanCopy( p );
    pNew = Wlc_NtkAlloc( p->pName, p->nObjsAlloc );
    pNew->fSmtLib = p->fSmtLib;
    pNew->fAsyncRst = p->fAsyncRst;
    pNew->fMemPorts = p->fMemPorts;
    pNew->fEasyFfs = p->fEasyFfs;
    Wlc_NtkForEachCi( p, pObj, i )
        if ( !fMarked || pObj->Mark )
        {
            unsigned Type = pObj->Type;
            if ( !fSeq ) pObj->Type = WLC_OBJ_PI;
            Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
            pObj->Type = Type;
        }
    Wlc_NtkForEachFf2( p, pObj, i )
    {
        int iObjNew = Wlc_ObjAlloc( pNew, pObj->Type, Wlc_ObjIsSigned(pObj), pObj->End, pObj->Beg );
        Wlc_ObjSetCopy( p, Wlc_ObjId(p, pObj), iObjNew );
        Vec_IntPush( &pNew->vFfs2, iObjNew );
    }
    Wlc_NtkForEachCo( p, pObj, i )
        if ( !fMarked || pObj->Mark )
            Wlc_NtkDupDfs_rec( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    Wlc_NtkForEachCo( p, pObj, i )
        if ( !fMarked || pObj->Mark )
            Wlc_ObjSetCo( pNew, Wlc_ObjCopyObj(pNew, p, pObj), fSeq ? pObj->fIsFi : 0 );
    Wlc_NtkForEachFf2( p, pObj, i )
    {
        iObj = Wlc_ObjId(p, pObj);
        Wlc_ObjForEachFanin( pObj, iFanin, k )
            Wlc_NtkDupDfs_rec( pNew, p, iFanin, vFanins );
        Wlc_ObjCollectCopyFanins( p, iObj, vFanins );
        pObjNew = Wlc_NtkObj( pNew, Wlc_ObjCopy(p, iObj) );
        Wlc_ObjAddFanins( pNew, pObjNew, vFanins );
        pObjNew->fXConst = pObj->fXConst;
    }
    Vec_IntFree( vFanins );
    if ( fSeq && p->vInits )
    {
        if ( fMarked )
        {
            if ( p->vInits )
                pNew->vInits = Wlc_ReduceMarkedInitVec( p, p->vInits );
            if ( p->pInits )
                pNew->pInits = Wlc_ReduceMarkedInitStr( p, p->pInits );
        }
        else
        {
            if ( p->vInits )
                pNew->vInits = Vec_IntDup( p->vInits );
            if ( p->pInits )
                pNew->pInits = Abc_UtilStrsav( p->pInits );
        }
    }
    if ( p->pSpec )
        pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( Wlc_NtkHasNameId(p) )
        Wlc_NtkTransferNames( pNew, p );
    if ( Vec_IntSize(&p->vPoPairs) )
        Vec_IntAppend( &pNew->vPoPairs, &p->vPoPairs );
    return pNew;
}